

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void aes_ctr_xor(aes_context *context,uint8_t *iv,uint64_t block,uint8_t *buffer,size_t size)

{
  uint8_t *puVar1;
  byte bVar2;
  uint32_t i;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint8_t counter [16];
  uint8_t tmp [16];
  
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    counter[lVar4] = iv[lVar4];
  }
  for (uVar3 = 0xf; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    bVar2 = counter[uVar3];
    counter[uVar3] = (uint8_t)(block + bVar2);
    block = block + bVar2 >> 8;
  }
  do {
    if (size < 0x10) {
      if (size != 0) {
        aes_encrypt(context,counter,tmp);
        for (uVar5 = 0; uVar5 < size; uVar5 = uVar5 + 1) {
          buffer[uVar5] = buffer[uVar5] ^ tmp[uVar5];
        }
      }
      return;
    }
    aes_encrypt(context,counter,tmp);
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      buffer[lVar4] = buffer[lVar4] ^ tmp[lVar4];
    }
    buffer = buffer + 0x10;
    uVar5 = 0xf;
    do {
      if ((int)uVar5 < 0) break;
      puVar1 = counter + uVar5;
      *puVar1 = *puVar1 + '\x01';
      uVar5 = (ulong)((int)uVar5 - 1);
    } while (*puVar1 == '\0');
    size = size - 0x10;
  } while( true );
}

Assistant:

void aes_ctr_xor(const aes_context* context, const uint8_t* iv, uint64_t block, uint8_t* buffer, size_t size)
{
    uint8_t tmp[16];
    uint8_t counter[16];
    for (uint32_t i=0; i<16; i++)
    {
        counter[i] = iv[i];
    }
    ctr_add(counter, block);

#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_ctr_xor_x86(context, counter, buffer, size);
        return;
    }
#endif

    while (size >= 16)
    {
        aes_encrypt(context, counter, tmp);
        for (uint32_t i=0; i<16; i++)
        {
            *buffer++ ^= tmp[i];
        }
        for (int i=15; i>=0; i--)
            if (++counter[i] != 0)
                break;
        size -= 16;
    }

    if (size != 0)
    {
        aes_encrypt(context, counter, tmp);
        for (size_t i=0; i<size; i++)
        {
            *buffer++ ^= tmp[i];
        }
    }
}